

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

void prof_firestart(CHAR_DATA *ch,char *argument)

{
  OBJ_DATA *pOVar1;
  bool bVar2;
  OBJ_DATA **ppOVar3;
  uint uVar4;
  char *txt;
  allocator<char> local_182;
  allocator<char> local_181;
  undefined8 local_180;
  undefined8 local_178;
  CHAR_DATA *ch_local;
  int local_168;
  int dur;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  ch_local = ch;
  bVar2 = is_affected_prof(ch,"firestarting");
  if (bVar2) {
    txt = "You cannot start another fire yet.\n\r";
  }
  else {
    uVar4 = (uint)(ushort)ch->in_room->sector_type;
    if ((uVar4 < 0x12) && ((0x203c2U >> (uVar4 & 0x1f) & 1) != 0)) {
      txt = "You can\'t build a fire here.\n\r";
    }
    else {
      ppOVar3 = &ch->in_room->contents;
      do {
        pOVar1 = *ppOVar3;
        if (pOVar1 == (OBJ_DATA *)0x0) {
          if (ch->level <= ch->move) {
            dur = 0xc;
            act("You begin to build a campfire, gathering sticks and twigs from your surroundings.",
                ch,(void *)0x0,(void *)0x0,3);
            act("$n begins to build a campfire, gathering sticks and twigs from $s surroundings.",ch
                ,(void *)0x0,(void *)0x0,0);
            ch->move = ch->move - ch->level;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_40,"prof_firestart",(allocator<char> *)&local_178);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_60,"send_to_char_queue",(allocator<char> *)&local_180);
            CQueue::
            AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[58],char_data*&>
                      (&RS.Queue,1,&local_40,&local_60,send_to_char_queue,
                       (char (*) [58])"You rub two sticks together, trying to produce a flame.\n\r",
                       &ch_local);
            std::__cxx11::string::~string((string *)&local_60);
            std::__cxx11::string::~string((string *)&local_40);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_80,"prof_firestart",&local_181);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a0,"act_queue",&local_182);
            local_178 = 0;
            local_180 = 0;
            local_168 = 0;
            CQueue::
            AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[56],char_data*&,decltype(nullptr),decltype(nullptr),int>
                      (&RS.Queue,1,&local_80,&local_a0,act_queue,
                       (char (*) [56])"$n rubs two sticks together, trying to produce a flame.",
                       &ch_local,(void **)&local_178,(void **)&local_180,&local_168);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,"prof_firestart",(allocator<char> *)&local_178);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_e0,"send_to_char_queue",(allocator<char> *)&local_180);
            CQueue::
            AddToQueue<void(*)(std::__cxx11::string,char_data*),char_const(&)[59],char_data*&>
                      (&RS.Queue,3,&local_c0,&local_e0,send_to_char_queue,
                       (char (*) [59])"The sticks begin to smoke, and soon you produce a spark.\n\r"
                       ,&ch_local);
            std::__cxx11::string::~string((string *)&local_e0);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_100,"prof_firestart",&local_181);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_120,"act_queue",&local_182);
            local_178 = 0;
            local_180 = 0;
            local_168 = 0;
            CQueue::
            AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[57],char_data*&,decltype(nullptr),decltype(nullptr),int>
                      (&RS.Queue,3,&local_100,&local_120,act_queue,
                       (char (*) [57])"The sticks begin to smoke, and soon $n produces a spark.",
                       &ch_local,(void **)&local_178,(void **)&local_180,&local_168);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_140,"prof_firestart",(allocator<char> *)&local_178);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_160,"build_fire",(allocator<char> *)&local_180);
            CQueue::AddToQueue<void(*)(char_data*,int),char_data*&,int&>
                      (&RS.Queue,5,&local_140,&local_160,build_fire,&ch_local,&dur);
            std::__cxx11::string::~string((string *)&local_160);
            std::__cxx11::string::~string((string *)&local_140);
            WAIT_STATE(ch_local,0x18);
            return;
          }
          txt = "You are too tired to gather wood.\n\r";
          goto LAB_003b14d9;
        }
        ppOVar3 = &pOVar1->next_content;
      } while (pOVar1->item_type != 0x22);
      txt = "There is already a fire burning here.\n\r";
    }
  }
LAB_003b14d9:
  send_to_char(txt,ch);
  return;
}

Assistant:

void prof_firestart(CHAR_DATA *ch, char *argument)
{
	if (is_affected_prof(ch, "firestarting"))
	{
		send_to_char("You cannot start another fire yet.\n\r", ch);
		return;
	}

	auto sect = ch->in_room->sector_type;
	if (sect == SECT_WATER || sect == SECT_UNDERWATER || sect == SECT_VERTICAL || sect == SECT_AIR || sect == SECT_CITY || sect == SECT_INSIDE)
	{
		send_to_char("You can't build a fire here.\n\r",ch);
		return;
	}

	for (auto fire = ch->in_room->contents; fire; fire = fire->next_content)
	{
		if (fire->item_type == ITEM_CAMPFIRE)
		{
			send_to_char("There is already a fire burning here.\n\r", ch);
			return;
		}
	}

	if (ch->move < ch->level)
	{
		send_to_char("You are too tired to gather wood.\n\r", ch);
		return;
	}

	auto dur = 12;
	act("You begin to build a campfire, gathering sticks and twigs from your surroundings.", ch, 0, 0, TO_CHAR);
	act("$n begins to build a campfire, gathering sticks and twigs from $s surroundings.", ch, 0, 0, TO_ROOM);
	ch->move -= ch->level;

	RS.Queue.AddToQueue(1, "prof_firestart", "send_to_char_queue", send_to_char_queue, "You rub two sticks together, trying to produce a flame.\n\r", ch);
	RS.Queue.AddToQueue(1, "prof_firestart", "act_queue", act_queue, "$n rubs two sticks together, trying to produce a flame.", ch, nullptr, nullptr, TO_ROOM);
	RS.Queue.AddToQueue(3, "prof_firestart", "send_to_char_queue", send_to_char_queue, "The sticks begin to smoke, and soon you produce a spark.\n\r", ch);
	RS.Queue.AddToQueue(3, "prof_firestart", "act_queue", act_queue, "The sticks begin to smoke, and soon $n produces a spark.", ch, nullptr, nullptr, TO_ROOM);
	RS.Queue.AddToQueue(5, "prof_firestart", "build_fire", build_fire, ch, dur);
	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}